

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
QUtil::read_lines_from_file_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,QUtil *this,char *filename,bool preserve_eol)

{
  FileCloser fc;
  FILE *f;
  FileCloser local_48;
  FILE *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  local_48.f = safe_fopen((char *)this,"rb");
  local_38._M_unused._M_object = &local_40;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(char_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QUtil.cc:1240:22)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(char_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QUtil.cc:1240:22)>
             ::_M_manager;
  local_40 = local_48.f;
  read_lines_from_file
            ((function<bool_(char_&)> *)&local_38,__return_storage_ptr__,SUB81(filename,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  FileCloser::~FileCloser(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string>
QUtil::read_lines_from_file(char const* filename, bool preserve_eol)
{
    std::list<std::string> lines;
    FILE* f = safe_fopen(filename, "rb");
    FileCloser fc(f);
    auto next_char = [&f](char& ch) { return read_char_from_FILE(ch, f); };
    read_lines_from_file(next_char, lines, preserve_eol);
    return lines;
}